

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL FEqualDbl(double dbl1,double dbl2)

{
  uint32 uVar1;
  uint uVar2;
  bool bVar3;
  uint32 *puVar4;
  bool local_29;
  double local_20;
  double dbl2_local;
  double dbl1_local;
  
  local_20 = dbl2;
  dbl2_local = dbl1;
  puVar4 = Js::NumberUtilities::LuLoDbl(&dbl2_local);
  uVar1 = *puVar4;
  puVar4 = Js::NumberUtilities::LuLoDbl(&local_20);
  if (uVar1 == *puVar4) {
    puVar4 = Js::NumberUtilities::LuHiDbl(&dbl2_local);
    uVar1 = *puVar4;
    puVar4 = Js::NumberUtilities::LuHiDbl(&local_20);
    if (uVar1 == *puVar4) {
      bVar3 = Js::NumberUtilities::IsNan(dbl2_local);
      dbl1_local._4_4_ = (uint)((bVar3 ^ 0xffU) & 1);
    }
    else {
      puVar4 = Js::NumberUtilities::LuHiDbl(&dbl2_local);
      uVar2 = *puVar4;
      puVar4 = Js::NumberUtilities::LuHiDbl(&local_20);
      local_29 = false;
      if ((uVar2 | *puVar4) == 0x80000000) {
        puVar4 = Js::NumberUtilities::LuLoDbl(&dbl2_local);
        local_29 = *puVar4 == 0;
      }
      dbl1_local._4_4_ = (uint)local_29;
    }
  }
  else {
    dbl1_local._4_4_ = 0;
  }
  return dbl1_local._4_4_;
}

Assistant:

BOOL FEqualDbl(double dbl1, double dbl2)
    {
        // If the low ulongs don't match, they can't be equal.
        if (Js::NumberUtilities::LuLoDbl(dbl1) != Js::NumberUtilities::LuLoDbl(dbl2))
            return FALSE;

        // If the high ulongs don't match, they can be equal iff one is -0 and
        // the other is +0.
        if (Js::NumberUtilities::LuHiDbl(dbl1) != Js::NumberUtilities::LuHiDbl(dbl2))
        {
            return 0x80000000 == (Js::NumberUtilities::LuHiDbl(dbl1) | Js::NumberUtilities::LuHiDbl(dbl2)) &&
                0 == Js::NumberUtilities::LuLoDbl(dbl1);
        }

        // The bit patterns match. They are equal iff they are not Nan.
        return !Js::NumberUtilities::IsNan(dbl1);
    }